

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::ParameterSymbol::getValue(ParameterSymbol *this,SourceRange referencingRange)

{
  bitmask<slang::ast::ASTFlags> flags;
  LookupLocation lookupLocation;
  SourceRange range;
  string_view arg;
  bool bVar1;
  Symbol *pSVar2;
  DeclaredType *this_00;
  SyntaxNode *this_01;
  Scope *this_02;
  Compilation *value;
  Type *in_RDX;
  Type *in_RSI;
  Symbol *in_RDI;
  Scope *scope_1;
  ImplicitTypeSyntax *its;
  DataTypeSyntax *typeSyntax;
  Expression *init;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_symbols_ParameterSymbols_cpp:140:33)>
  guard;
  Diagnostic *diag;
  ASTContext ctx;
  Scope *scope;
  ASTContext *in_stack_000001d0;
  bitmask<slang::ast::EvalFlags> in_stack_000001df;
  ValueSymbol *in_stack_fffffffffffffe28;
  Compilation *in_stack_fffffffffffffe30;
  Compilation *this_03;
  ASTContext *in_stack_fffffffffffffe38;
  undefined6 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe46;
  undefined1 in_stack_fffffffffffffe47;
  SourceLocation in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  DiagCode in_stack_fffffffffffffe54;
  SourceLocation in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  DiagCode noteCode;
  Diagnostic *in_stack_fffffffffffffe70;
  size_t in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  undefined1 local_168 [32];
  Expression *in_stack_fffffffffffffeb8;
  Expression *local_e0;
  anon_class_8_1_8991fb9c_for_func local_d8;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_symbols_ParameterSymbols_cpp:140:33)>
  local_d0;
  Type *local_c0;
  Type *local_b8;
  undefined4 local_ac;
  byte *local_a8;
  Segment *local_a0;
  SourceLocation local_98;
  undefined4 local_8c;
  Diagnostic *local_88;
  bitmask<slang::ast::ASTFlags> local_80;
  bitmask<slang::ast::ASTFlags> local_78;
  BumpAllocator *local_70;
  FreeNode *local_68;
  bitmask<slang::ast::ASTFlags> abStack_50 [5];
  Type *local_28;
  Type *local_18;
  Type *local_10;
  undefined1 *local_8;
  
  noteCode = SUB84((ulong)in_stack_fffffffffffffe60 >> 0x20,0);
  if (in_RDI[5].nextInScope == (Symbol *)0x0) {
    local_18 = in_RSI;
    local_10 = in_RDX;
    local_28 = (Type *)Symbol::getParentScope(in_RDI);
    local_70 = LookupLocation::max;
    local_68 = DAT_00dfe660;
    bitmask<slang::ast::ASTFlags>::bitmask(&local_78,None);
    lookupLocation.index = in_stack_fffffffffffffe50;
    lookupLocation.scope = (Scope *)in_stack_fffffffffffffe48;
    lookupLocation._12_2_ = in_stack_fffffffffffffe54.subsystem;
    lookupLocation._14_2_ = in_stack_fffffffffffffe54.code;
    flags.m_bits._6_1_ = in_stack_fffffffffffffe46;
    flags.m_bits._0_6_ = in_stack_fffffffffffffe40;
    flags.m_bits._7_1_ = in_stack_fffffffffffffe47;
    ASTContext::ASTContext
              (in_stack_fffffffffffffe38,(Scope *)in_stack_fffffffffffffe30,lookupLocation,flags);
    if ((in_RDI[5].indexInScope & 0x1000000) != 0) {
      bitmask<slang::ast::ASTFlags>::bitmask(&local_80,ConfigParam);
      bitmask<slang::ast::ASTFlags>::operator|=(abStack_50,&local_80);
    }
    if ((in_RDI[5].indexInScope & 0x10000) != 0) {
      local_8c = 0x17000c;
      local_98 = in_RDI->location;
      ASTContext::addDiag((ASTContext *)
                          CONCAT17(in_stack_fffffffffffffe47,
                                   CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
                          in_stack_fffffffffffffe54,in_stack_fffffffffffffe48);
      local_a8 = (byte *)(in_RDI->name)._M_len;
      local_a0 = (Segment *)(in_RDI->name)._M_str;
      arg._M_str = in_stack_fffffffffffffe80;
      arg._M_len = in_stack_fffffffffffffe78;
      local_88 = Diagnostic::operator<<(in_stack_fffffffffffffe70,arg);
      local_ac = 0xd0001;
      local_c0 = local_18;
      local_b8 = local_10;
      range.startLoc._4_2_ = in_stack_fffffffffffffe54.subsystem;
      range.startLoc._6_2_ = in_stack_fffffffffffffe54.code;
      range.startLoc._0_4_ = in_stack_fffffffffffffe50;
      range.endLoc = in_stack_fffffffffffffe58;
      Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffffe48,noteCode,range);
      local_8 = slang::ConstantValue::Invalid;
      return (ConstantValue *)local_8;
    }
    *(byte *)((long)&in_RDI[5].indexInScope + 2) = 1;
    ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/ast/symbols/ParameterSymbols.cpp:140:33)>
    ::ScopeGuard(&local_d0,&local_d8);
    local_e0 = ValueSymbol::getInitializer((ValueSymbol *)0x4c7c56);
    if (local_e0 == (Expression *)0x0) {
      in_RDI[5].nextInScope = (Symbol *)slang::ConstantValue::Invalid;
    }
    else {
      Scope::getCompilation((Scope *)local_28);
      bitmask<slang::ast::EvalFlags>::bitmask
                ((bitmask<slang::ast::EvalFlags> *)&stack0xfffffffffffffee7,
                 AllowUnboundedPlaceholder);
      ASTContext::eval(in_stack_000001d0,(Expression *)referencingRange.endLoc,in_stack_000001df);
      pSVar2 = (Symbol *)
               Compilation::allocConstant
                         (in_stack_fffffffffffffe30,(ConstantValue *)in_stack_fffffffffffffe28);
      in_RDI[5].nextInScope = pSVar2;
      slang::ConstantValue::~ConstantValue((ConstantValue *)0x4c7d07);
      ValueSymbol::getDeclaredType(in_stack_fffffffffffffe28);
      this_00 = not_null<const_slang::ast::DeclaredType_*>::operator->
                          ((not_null<const_slang::ast::DeclaredType_*> *)0x4c7d32);
      this_01 = (SyntaxNode *)DeclaredType::getTypeSyntax(this_00);
      if ((this_01 != (SyntaxNode *)0x0) && (this_01->kind == ImplicitType)) {
        slang::syntax::SyntaxNode::as<slang::syntax::ImplicitTypeSyntax>(this_01);
        bVar1 = parsing::Token::operator_cast_to_bool((Token *)0x4c7dac);
        if ((!bVar1) &&
           (bVar1 = std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::
                    empty((span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *)
                          0x4c7dd1), bVar1)) {
          bVar1 = Expression::isImplicitString(in_stack_fffffffffffffeb8);
          *(bool *)&in_RDI[5].indexInScope = bVar1;
        }
      }
    }
    ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/ast/symbols/ParameterSymbols.cpp:140:33)>
    ::~ScopeGuard((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_symbols_ParameterSymbols_cpp:140:33)>
                   *)in_stack_fffffffffffffe30);
  }
  else if ((in_RDI[5].indexInScope & 0x100) != 0) {
    this_02 = Symbol::getParentScope(in_RDI);
    value = Scope::getCompilation(this_02);
    ValueSymbol::getType((ValueSymbol *)0x4c7eb3);
    this_03 = (Compilation *)local_168;
    Type::coerceValue((Type *)in_stack_fffffffffffffe58,
                      (ConstantValue *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
                     );
    pSVar2 = (Symbol *)Compilation::allocConstant(this_03,(ConstantValue *)value);
    in_RDI[5].nextInScope = pSVar2;
    slang::ConstantValue::~ConstantValue((ConstantValue *)0x4c7f01);
    *(byte *)((long)&in_RDI[5].indexInScope + 1) = 0;
  }
  return (ConstantValue *)in_RDI[5].nextInScope;
}

Assistant:

const ConstantValue& ParameterSymbol::getValue(SourceRange referencingRange) const {
    if (!value) {
        auto scope = getParentScope();
        SLANG_ASSERT(scope);

        ASTContext ctx(*scope, LookupLocation::max);
        if (isFromConf)
            ctx.flags |= ASTFlags::ConfigParam;

        if (evaluating) {
            SLANG_ASSERT(referencingRange.start());

            auto& diag = ctx.addDiag(diag::ConstEvalParamCycle, location) << name;
            diag.addNote(diag::NoteReferencedHere, referencingRange);
            return ConstantValue::Invalid;
        }

        evaluating = true;
        auto guard = ScopeGuard([this] { evaluating = false; });

        // If no value has been explicitly set, try to set it
        // from our initializer.
        auto init = getInitializer();
        if (init) {
            value = scope->getCompilation().allocConstant(
                ctx.eval(*init, EvalFlags::AllowUnboundedPlaceholder));

            // If this parameter has an implicit type declared and it was assigned
            // a string literal, make a note so that this parameter gets treated
            // as an implicit string itself in further expressions.
            auto typeSyntax = getDeclaredType()->getTypeSyntax();
            if (typeSyntax && typeSyntax->kind == SyntaxKind::ImplicitType) {
                auto& its = typeSyntax->as<ImplicitTypeSyntax>();
                if (!its.signing && its.dimensions.empty())
                    fromStringLit = init->isImplicitString();
            }
        }
        else {
            value = &ConstantValue::Invalid;
        }
    }
    else if (needsCoercion) {
        auto scope = getParentScope();
        SLANG_ASSERT(scope);

        value = scope->getCompilation().allocConstant(getType().coerceValue(*value));
        needsCoercion = false;
    }

    return *value;
}